

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O0

int Tru_ManInsert(Tru_Man_t *p,word *pTruth)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  Tru_One_t *pTVar5;
  int iVar6;
  Tru_One_t *pEntry;
  int *pSpot;
  int fCompl;
  word *pTruth_local;
  Tru_Man_t *p_local;
  
  iVar2 = Tru_ManEqual0(pTruth,p->nWords);
  if (iVar2 == 0) {
    iVar2 = Tru_ManEqual1(pTruth,p->nWords);
    if (iVar2 == 0) {
      p->nTableLookups = p->nTableLookups + 1;
      iVar2 = Vec_SetEntryNum(p->pMem);
      iVar6 = p->nTableSize * 2;
      if (iVar2 != iVar6 && SBORROW4(iVar2,iVar6) == iVar2 + p->nTableSize * -2 < 0) {
        Tru_ManResize(p);
      }
      uVar1 = *pTruth;
      if ((uVar1 & 1) != 0) {
        Tru_ManNot(pTruth,p->nWords);
      }
      puVar4 = (uint *)Tru_ManLookup(p,pTruth);
      if (*puVar4 == 0) {
        uVar3 = Vec_SetAppend(p->pMem,(int *)0x0,p->nEntrySize);
        *puVar4 = uVar3;
        if ((*puVar4 & 1) != 0) {
          __assert_fail("(*pSpot & 1) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satTruth.c"
                        ,0xb0,"int Tru_ManInsert(Tru_Man_t *, word *)");
        }
        pTVar5 = Tru_ManReadOne(p,*puVar4);
        Tru_ManCopy((word *)(pTVar5 + 1),pTruth,p->nWords);
        pTVar5->Handle = *puVar4;
        pTVar5->Next = 0;
      }
      if ((uVar1 & 1) != 0) {
        Tru_ManNot(pTruth,p->nWords);
      }
      p_local._4_4_ = *puVar4 ^ (uint)uVar1 & 1;
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Tru_ManInsert( Tru_Man_t * p, word * pTruth )
{
    int fCompl, * pSpot;
    if ( Tru_ManEqual0(pTruth, p->nWords) )
        return 0;
    if ( Tru_ManEqual1(pTruth, p->nWords) )
        return 1;
    p->nTableLookups++;
    if ( Vec_SetEntryNum(p->pMem) > 2 * p->nTableSize )
        Tru_ManResize( p );
    fCompl = pTruth[0] & 1;
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    pSpot = Tru_ManLookup( p, pTruth );
    if ( *pSpot == 0 )
    {
        Tru_One_t * pEntry;
        *pSpot = Vec_SetAppend( p->pMem, NULL, p->nEntrySize );
        assert( (*pSpot & 1) == 0 );
        pEntry = Tru_ManReadOne( p, *pSpot );
        Tru_ManCopy( pEntry->pTruth, pTruth, p->nWords );
        pEntry->Handle = *pSpot;
        pEntry->Next = 0;
    }
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    return *pSpot ^ fCompl;
}